

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::
GenMatcher<Kernel::TypedTermList>(GenMatcher *this,TypedTermList query,uint nextSpecVar)

{
  (this->_specVars)._size = 0;
  (this->_specVars)._capacity = 0;
  (this->_boundVars)._cursor = (uint *)0x0;
  (this->_boundVars)._end = (uint *)0x0;
  (this->_boundVars)._capacity = 0;
  (this->_boundVars)._stack = (uint *)0x0;
  (this->_specVars)._array = (TermList *)0x0;
  Lib::ArrayMap<Kernel::TermList>::ArrayMap(&this->_bindings);
  init<Kernel::TypedTermList>(this,query,nextSpecVar);
  return;
}

Assistant:

GenMatcher(TermOrLit query, unsigned nextSpecVar)
      { init(query,nextSpecVar); }